

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O3

bool tinyusdz::anon_unknown_28::FindPrimByPrimIdRec
               (uint64_t prim_id,Prim *root,Prim **primFound,int level,string *err)

{
  pointer pPVar1;
  bool bVar2;
  Prim *child;
  pointer root_00;
  
  if (primFound != (Prim **)0x0 && level < 0x8000001) {
    if (root->_prim_id == prim_id) {
      *primFound = root;
      return true;
    }
    root_00 = (root->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pPVar1 = (root->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (root_00 != pPVar1) {
      do {
        bVar2 = FindPrimByPrimIdRec(prim_id,root_00,primFound,level + 1,err);
        if (bVar2) {
          return bVar2;
        }
        root_00 = root_00 + 1;
      } while (root_00 != pPVar1);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool FindPrimByPrimIdRec(uint64_t prim_id, const Prim *root,
                         const Prim **primFound, int level, std::string *err) {
  if (level > 1024 * 1024 * 128) {
    // too deep node.
    return false;
  }

  if (!primFound) {
    return false;
  }

  if (root->prim_id() == int64_t(prim_id)) {
    (*primFound) = root;
    return true;
  }

  // Brute-force search.
  for (const auto &child : root->children()) {
    if (FindPrimByPrimIdRec(prim_id, &child, primFound, level + 1, err)) {
      return true;
    }
  }

  return false;
}